

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

Var Js::JavascriptArray::ProfiledNewScArray
              (uint32 elementCount,ScriptContext *scriptContext,ArrayCallSiteInfo *arrayInfo,
              RecyclerWeakReference<Js::FunctionBody> *weakFuncRef)

{
  bool bVar1;
  ThreadContext *threadContext;
  JavascriptLibrary *pJVar2;
  JavascriptArray *arr;
  JavascriptNativeFloatArray *arr_2;
  JavascriptNativeIntArray *arr_1;
  undefined1 local_50 [8];
  JsReentLock reentrancylock;
  RecyclerWeakReference<Js::FunctionBody> *weakFuncRef_local;
  ArrayCallSiteInfo *arrayInfo_local;
  ScriptContext *scriptContext_local;
  JavascriptNativeArray *pJStack_10;
  uint32 elementCount_local;
  
  reentrancylock._24_8_ = weakFuncRef;
  threadContext = ScriptContext::GetThreadContext(scriptContext);
  JsReentLock::JsReentLock((JsReentLock *)local_50,threadContext);
  bVar1 = ArrayCallSiteInfo::IsNativeIntArray(arrayInfo);
  if (bVar1) {
    pJVar2 = ScriptContext::GetLibrary(scriptContext);
    pJStack_10 = &JavascriptLibrary::CreateNativeIntArrayLiteral(pJVar2,elementCount)->
                  super_JavascriptNativeArray;
    JavascriptNativeArray::SetArrayProfileInfo
              (pJStack_10,(RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_,arrayInfo
              );
  }
  else {
    bVar1 = ArrayCallSiteInfo::IsNativeFloatArray(arrayInfo);
    if (bVar1) {
      pJVar2 = ScriptContext::GetLibrary(scriptContext);
      pJStack_10 = &JavascriptLibrary::CreateNativeFloatArrayLiteral(pJVar2,elementCount)->
                    super_JavascriptNativeArray;
      JavascriptNativeArray::SetArrayProfileInfo
                (pJStack_10,(RecyclerWeakReference<Js::FunctionBody> *)reentrancylock._24_8_,
                 arrayInfo);
    }
    else {
      pJVar2 = ScriptContext::GetLibrary(scriptContext);
      pJStack_10 = (JavascriptNativeArray *)
                   JavascriptLibrary::CreateArrayLiteral(pJVar2,elementCount);
    }
  }
  JsReentLock::~JsReentLock((JsReentLock *)local_50);
  return pJStack_10;
}

Assistant:

Var JavascriptArray::ProfiledNewScArray(uint32 elementCount, ScriptContext *scriptContext, ArrayCallSiteInfo *arrayInfo, RecyclerWeakReference<FunctionBody> *weakFuncRef)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(ScrArr_ProfiledNewScArray, reentrancylock, scriptContext->GetThreadContext());
        if (arrayInfo->IsNativeIntArray())
        {
            JavascriptNativeIntArray *arr = scriptContext->GetLibrary()->CreateNativeIntArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        if (arrayInfo->IsNativeFloatArray())
        {
            JavascriptNativeFloatArray *arr = scriptContext->GetLibrary()->CreateNativeFloatArrayLiteral(elementCount);
            arr->SetArrayProfileInfo(weakFuncRef, arrayInfo);
            return arr;
        }

        JavascriptArray *arr = scriptContext->GetLibrary()->CreateArrayLiteral(elementCount);
        return arr;
        JIT_HELPER_END(ScrArr_ProfiledNewScArray);
    }